

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::dragMoveEvent(QListView *this,QDragMoveEvent *e)

{
  uint uVar1;
  ViewMode VVar2;
  Flow FVar3;
  QListViewPrivate *pQVar4;
  undefined8 in_RSI;
  QListView *in_RDI;
  QListViewPrivate *d;
  QDragMoveEvent *in_stack_00000048;
  QAbstractItemView *in_stack_00000050;
  QDragMoveEvent *in_stack_00000060;
  QListModeViewBase *in_stack_00000068;
  
  pQVar4 = d_func((QListView *)0x879321);
  uVar1 = (*pQVar4->commonListView->_vptr_QCommonListViewBase[0x15])(pQVar4->commonListView,in_RSI);
  if ((uVar1 & 1) == 0) {
    VVar2 = viewMode(in_RDI);
    if ((VVar2 == ListMode) && (FVar3 = flow(in_RDI), FVar3 == LeftToRight)) {
      QListModeViewBase::dragMoveEvent(in_stack_00000068,in_stack_00000060);
    }
    else {
      QAbstractItemView::dragMoveEvent(in_stack_00000050,in_stack_00000048);
    }
  }
  return;
}

Assistant:

void QListView::dragMoveEvent(QDragMoveEvent *e)
{
    Q_D(QListView);
    if (!d->commonListView->filterDragMoveEvent(e)) {
        if (viewMode() == QListView::ListMode && flow() == QListView::LeftToRight)
            static_cast<QListModeViewBase *>(d->commonListView)->dragMoveEvent(e);
        else
            QAbstractItemView::dragMoveEvent(e);
    }
}